

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thinlenscamera.hpp
# Opt level: O1

Ray * __thiscall
ThinlensCamera::sampleray
          (Ray *__return_storage_ptr__,ThinlensCamera *this,vec2f pos,Sampler *sampler)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  float extraout_XMM0_Da;
  float fVar8;
  float fVar9;
  float fVar10;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db_01;
  float fVar12;
  float fVar13;
  undefined4 in_XMM2_Db;
  float fVar14;
  float fVar16;
  undefined1 auVar15 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float local_78;
  float fStack_74;
  
  (*sampler->_vptr_Sampler[5])(sampler);
  fVar20 = this->lensradius;
  fVar8 = (this->lefthalf).x;
  fVar10 = (this->lefthalf).y;
  fVar14 = (this->lefthalf).z;
  fVar8 = fVar14 * fVar14 + fVar8 * fVar8 + fVar10 * fVar10;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
    in_XMM2_Db = extraout_XMM0_Db_00;
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  fVar10 = (this->lefthalf).x;
  fVar14 = (this->lefthalf).y;
  fVar17 = (this->lefthalf).z;
  fVar9 = (this->uphalf).x;
  fVar18 = (this->uphalf).y;
  fVar19 = (this->uphalf).z;
  uVar11 = 0;
  fVar9 = fVar19 * fVar19 + fVar9 * fVar9 + fVar18 * fVar18;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
    uVar11 = extraout_XMM0_Db_01;
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  local_78 = pos.x;
  fStack_74 = pos.y;
  fVar12 = (float)DAT_00157730 - (local_78 + local_78);
  fVar13 = DAT_00157730._4_4_ - (fStack_74 + fStack_74);
  fVar18 = (this->uphalf).z;
  fVar19 = this->focaldistance;
  auVar15._4_4_ = fVar8;
  auVar15._0_4_ = fVar9;
  auVar15._8_4_ = uVar11;
  auVar15._12_4_ = in_XMM2_Db;
  auVar15 = divps(_DAT_00157730,auVar15);
  uVar1 = (this->super_Camera).position.x;
  uVar5 = (this->super_Camera).position.y;
  uVar4 = *(undefined8 *)&(this->super_Camera).field_0x3c;
  uVar2 = (this->uphalf).x;
  uVar6 = (this->uphalf).y;
  fVar8 = auVar15._0_4_;
  fVar16 = auVar15._4_4_;
  fVar9 = fVar20 * (fVar10 * fVar16 * extraout_XMM0_Da + extraout_XMM0_Db * (float)uVar2 * fVar8);
  fVar14 = fVar20 * ((float)uVar6 * fVar8 * extraout_XMM0_Db + extraout_XMM0_Da * fVar14 * fVar16);
  fVar20 = (fVar18 * fVar8 * extraout_XMM0_Db + fVar17 * fVar16 * extraout_XMM0_Da) * fVar20;
  uVar3 = (this->lefthalf).x;
  uVar7 = (this->lefthalf).y;
  fVar17 = (fVar18 * fVar13 + *(float *)&this->field_0x44 + (this->lefthalf).z * fVar12) * fVar19 -
           fVar20;
  fVar8 = (this->super_Camera).position.z;
  fVar18 = fVar19 * (fVar13 * (float)uVar2 + fVar12 * (float)uVar3 + (float)uVar4) - fVar9;
  fVar19 = fVar19 * (fVar13 * (float)uVar6 + fVar12 * (float)uVar7 + (float)((ulong)uVar4 >> 0x20))
           - fVar14;
  fVar10 = fVar17 * fVar17 + fVar18 * fVar18 + fVar19 * fVar19;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  fVar10 = 1.0 / fVar10;
  (__return_storage_ptr__->origin).x = (float)uVar1 + fVar9;
  (__return_storage_ptr__->origin).y = (float)uVar5 + fVar14;
  (__return_storage_ptr__->origin).z = fVar20 + fVar8;
  (__return_storage_ptr__->dir).x = fVar18 * fVar10;
  (__return_storage_ptr__->dir).y = fVar19 * fVar10;
  (__return_storage_ptr__->dir).z = fVar17 * fVar10;
  return __return_storage_ptr__;
}

Assistant:

Ray sampleray(vec2f pos, Sampler& sampler) const {
		vec2f u = sampler.sampleUnitDisk();
		vec3f aperture_sample = lensradius * (u.x * normalized(lefthalf) + u.y * normalized(uphalf));
		vec3f focused_rel = (dir + (1-pos.x*2) * lefthalf + (1-pos.y*2) * uphalf) * focaldistance;
		return Ray(position + aperture_sample, normalized(focused_rel - aperture_sample));
	}